

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar1.cpp
# Opt level: O1

int main(int argc,char **arg)

{
  char cVar1;
  int iVar2;
  char *__s;
  VideoCapture capture;
  Mat frame;
  ofstream ofs;
  VideoCapture aVStack_308 [48];
  Mat local_2d8 [96];
  Mat local_278 [96];
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  cv::VideoCapture::VideoCapture(aVStack_308,0,0);
  cv::Mat::Mat(local_2d8);
  cVar1 = cv::CascadeClassifier::load((string *)hand_classifier);
  if (cVar1 == '\0') {
    __s = "--(!)Error loading";
  }
  else {
    cVar1 = cv::CascadeClassifier::load((string *)fist_classifier);
    if ((cVar1 != '\0') &&
       (cVar1 = cv::CascadeClassifier::load((string *)face_classifier), cVar1 != '\0')) {
      puts("done!");
      do {
        cv::VideoCapture::operator>>(aVStack_308,local_2d8);
        cVar1 = cv::Mat::empty();
        if (cVar1 != '\0') {
          printf(" --(!) No captured frame -- Break!");
          break;
        }
        cv::Mat::Mat(local_278,local_2d8);
        detectAndDisplay(local_278);
        cv::Mat::~Mat(local_278);
        cVar1 = cv::waitKey(10);
      } while (cVar1 != 'q');
      std::ofstream::close();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cmae",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::ofstream::ofstream(&local_218);
      std::ofstream::open((char *)&local_218,0x10305d);
      std::ofstream::close();
      local_218 = _VTT;
      *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _put;
      std::filebuf::~filebuf(local_210);
      std::ios_base::~ios_base(local_120);
      iVar2 = 0;
      goto LAB_0010264f;
    }
    __s = " Error ";
  }
  puts(__s);
  iVar2 = -1;
LAB_0010264f:
  cv::Mat::~Mat(local_2d8);
  cv::VideoCapture::~VideoCapture(aVStack_308);
  return iVar2;
}

Assistant:

int main( int argc, const char** arg )
 {
   //char filename[] = "out.txt"
   //freopen ("out.txt", "w", stdout);
   VideoCapture capture(0);

   Mat frame;
   //-- 1. Load the cascades
   if(  !hand_classifier.load( hand_cascade_name ) ){ printf("--(!)Error loading\n"); return -1; }
   if ( !fist_classifier.load( fist_cascade_name) ) { printf(" Error \n"); return -1; }
   if ( !face_classifier.load( face_cascade_name)) { printf(" Error \n"); return -1; }
//   if ( !left_classifier.load( left_cascade_name)) { printf(" Error \n"); return -1; }
   else printf("done!\n");
   //-- 2. Read the video stream
     while( true )
     {
        capture >> frame;
   //-- 3. Apply the classifier to the frame
       if( !frame.empty() )
       { 
           detectAndDisplay( frame );
       }
       else
       { 
         printf(" --(!) No captured frame -- Break!"); break; 
       }
       int c = waitKey(10);
       if( (char)c == 'q' ) { break; }
       //if( (char)c == 'c' ) { goto L1; }
      }

      outfile.close();
      cout<<"cmae"<<"\n";
      //outfile2.close();
      //outfile3.close();
      //if (remove("out.txt")!=0) perror("File deletion failed");
      //else cout << "File deleted successfully"; 
      std::ofstream ofs;
      ofs.open("out.txt", std::ofstream::out | std::ofstream::trunc);
      ofs.close();
      //remove("fist.txt");
      //remove("face.txt");
      //fclose (stdout);
   return 0; 
 }